

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdBool32x4OperationX86X64.cpp
# Opt level: O1

bool Js::SIMDBool32x4Operation::OpAnyTrue<short>(SIMDValue *simd)

{
  undefined1 auVar1 [16];
  uint i;
  long lVar2;
  Type local_18;
  ulong uStack_10;
  
  local_18 = (simd->field_0).i64[0];
  uStack_10 = (simd->field_0).i64[1];
  lVar2 = 0;
  do {
    *(ushort *)((long)&local_18 + lVar2 * 2) =
         -(ushort)(*(short *)((long)&local_18 + lVar2 * 2) != 0);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  auVar1._8_8_ = uStack_10;
  auVar1._0_8_ = local_18;
  return (((((((((((((((auVar1 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                      (auVar1 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar1 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar1 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar1 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar1 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar1 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar1 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (uStack_10 >> 7 & 1) != 0) || (uStack_10 >> 0xf & 1) != 0) ||
             (uStack_10 >> 0x17 & 1) != 0) || (uStack_10 >> 0x1f & 1) != 0) ||
           (uStack_10 >> 0x27 & 1) != 0) || (uStack_10 >> 0x2f & 1) != 0) ||
         (uStack_10 >> 0x37 & 1) != 0) || (long)uStack_10 < 0;
}

Assistant:

bool SIMDBool32x4Operation::OpAnyTrue(const SIMDValue& simd)
    {
        SIMDValue canonSimd = SIMDUtils::CanonicalizeToBools<T>(simd); //copy-by-value since we need to modify the copy
        X86SIMDValue x86Simd = X86SIMDValue::ToX86SIMDValue(canonSimd);
        int mask_8 = _mm_movemask_epi8(x86Simd.m128i_value); //latency 3, throughput 1
        return mask_8 != 0;
    }